

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O2

void speak_file_to_file(OpenJTalk *openjtalk,FILE *fp)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char line [260];
  char acStack_138 [264];
  
  if (fp != (FILE *)0x0) {
    iVar1 = getc((FILE *)fp);
    if ((((char)iVar1 != -0x11) || (iVar1 = getc((FILE *)fp), (char)iVar1 != -0x45)) ||
       (iVar1 = getc((FILE *)fp), (char)iVar1 != -0x41)) {
      fseek((FILE *)fp,0,0);
    }
    __s = (char *)malloc(0x105);
    *__s = '\0';
    while (pcVar2 = fgets(acStack_138,0x104,(FILE *)fp), pcVar2 != (char *)0x0) {
      remove_cr_lf(acStack_138);
      sVar3 = strlen(acStack_138);
      if (sVar3 != 0) {
        sVar4 = strlen(__s);
        __s = (char *)realloc(__s,(ulong)(sVar4 != 0) + sVar3 + sVar4 + 1);
        if (sVar4 != 0) {
          sVar3 = strlen(__s);
          (__s + sVar3)[0] = ' ';
          (__s + sVar3)[1] = '\0';
        }
        strcat(__s,acStack_138);
      }
    }
    openjtalk_speakToFile(openjtalk,__s,outfile);
    return;
  }
  return;
}

Assistant:

void speak_file_to_file(OpenJTalk *openjtalk, FILE *fp)
{
	if (fp == NULL)
	{
		return;
	}

	if ((getc(fp) & 0xFF) != 0xEF || (getc(fp) & 0xFF) != 0xBB || (getc(fp) & 0xFF) != 0xBF)
	{
		fseek(fp, 0, SEEK_SET);
	}

	char *str = (char*)malloc(sizeof(char)*MAX_PATH + 1);
	strcpy(str, "");

	char line[MAX_PATH];
	while (fgets(line, MAX_PATH, fp) != NULL)
	{
		remove_cr_lf(line);
		if (strlen(line) == 0)
		{
			continue;
		}

		size_t len = strlen(str);
		str = (char*)realloc(str, len + (len>0 ? 1 : 0) + strlen(line) + 1);
		if (len > 0)
		{
			strcat(str, " ");
		}
		strcat(str, line);
	}

	openjtalk_speakToFile(openjtalk, str, outfile);
}